

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Array<unsigned_int>::append(Array<unsigned_int> *this,uint *values,usize size)

{
  uint *puVar1;
  uint *end;
  uint *item;
  usize oldSize;
  usize size_local;
  uint *values_local;
  Array<unsigned_int> *this_local;
  
  reserve(this,((long)(this->_end).item - (long)(this->_begin).item >> 2) + size);
  end = (this->_end).item;
  puVar1 = end + size;
  size_local = (usize)values;
  for (; end < puVar1; end = end + 1) {
    *end = *(uint *)size_local;
    size_local = size_local + 4;
  }
  (this->_end).item = end;
  return;
}

Assistant:

void append(const T* values, usize size)
  {
    usize oldSize = _end.item - _begin.item;
    reserve(oldSize + size);
    T* item = _end.item;
    for(T* end = item + size; item < end; ++item, ++values)
    {
#ifdef VERIFY
      VERIFY(new(item) T(*values) == item);
#else
      new(item) T(*values);
#endif
    }
    _end.item = item;
  }